

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O3

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void>::
eval_exc_vxc_<int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  double __x;
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  host_buffer_type eps;
  host_buffer_type vrho;
  host_buffer_type vsigma;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  eps = *args_3;
  vrho = *args_4;
  vsigma = *args_5;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinPBE_X>(N,rho,sigma,eps,vrho,vsigma);
    return;
  }
  if (0 < (int)N) {
    uVar1 = 0;
    do {
      __x = rho[uVar1];
      dVar9 = 0.0;
      dVar7 = 0.0;
      dVar2 = 0.0;
      if (1e-32 < __x) {
        dVar2 = sigma[uVar1];
        dVar7 = 4.64158883361283e-86;
        if (4.64158883361283e-86 <= dVar2) {
          dVar7 = dVar2;
        }
        dVar9 = __x * 0.5;
        dVar3 = cbrt(1.0);
        dVar4 = cbrt(__x);
        dVar5 = __x * __x;
        dVar2 = (dVar7 * 0.08669247488762274 * 1.5874010519681996 *
                ((1.0 / (dVar4 * dVar4)) / dVar5)) / 24.0 + 0.804;
        dVar6 = (1.0 - 0.804 / dVar2) * 0.804 + 1.0;
        dVar10 = (1.0 / (dVar2 * dVar2)) * 0.2195149727645171;
        dVar8 = 0.0;
        if (1e-32 < dVar9) {
          dVar8 = ((dVar3 * -0.9847450218426964) / (dVar4 * dVar4)) * dVar6 * 0.125 +
                  ((((dVar3 * 0.9847450218426964) / dVar4) / (__x * dVar5)) * 0.6464160000000001 *
                  dVar10 * 1.8171205928321397 * dVar7 * 0.21733691746289932 * 1.5874010519681996) /
                  24.0;
        }
        dVar2 = 0.0;
        if (1e-32 < dVar9) {
          dVar2 = dVar10 * 0.6269081516456065 *
                  (((dVar3 * -0.9847450218426964) / dVar4) / dVar5) * 0.6464160000000001 * 0.015625;
        }
        dVar6 = dVar3 * -0.36927938319101117 * dVar4 * dVar6;
        dVar9 = (double)(~-(ulong)(dVar9 <= 1e-32) & (ulong)(dVar6 + dVar6));
        dVar7 = dVar8 * (__x + __x) + dVar9;
        dVar2 = (__x + __x) * dVar2;
      }
      eps[uVar1] = dVar9;
      vrho[uVar1] = dVar7;
      vsigma[uVar1] = dVar2;
      uVar1 = uVar1 + 1;
    } while (N != uVar1);
  }
  return;
}

Assistant:

void eval_exc_vxc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }